

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::CommandMigrate
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr,string *aDstNetworkName)

{
  char cVar1;
  ErrorCode EVar2;
  int iVar3;
  Error *pEVar4;
  function<void_(ot::commissioner::Error)> *this_00;
  char *pcVar5;
  char *pcVar6;
  string *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  undefined1 local_1f8 [8];
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  parse_func local_1d0 [1];
  code *local_1c8;
  undefined1 local_1c0 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  string local_198;
  writer write;
  Error error;
  Address dstAddr;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_e0 [40];
  Request request;
  
  error.mCode = kNone;
  error.mMessage._M_dataplus._M_p = (pointer)&error.mMessage.field_2;
  error.mMessage._M_string_length = 0;
  error.mMessage.field_2._M_local_buf[0] = '\0';
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coap::Message::Message(&request,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])(this);
  if ((char)iVar3 == '\0') {
    local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
    local_1f0._M_p = "the commissioner is not active";
    local_1e8 = 0x1e;
    local_1e0._M_allocated_capacity = 0;
    local_1d0[0] = (parse_func)0x0;
    pcVar5 = "the commissioner is not active";
    local_1e0._8_8_ = local_1f8;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1f8);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_1f8;
    ::fmt::v10::vformat_abi_cxx11_(&local_198,(v10 *)0x1ed3ff,(string_view)ZEXT816(0x1e),args);
    local_1c0._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_1b8,(string *)&local_198);
LAB_001546e0:
    Error::operator=(&error,(Error *)local_1c0);
    std::__cxx11::string::~string((string *)&local_1b8);
    this_01 = &local_198;
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 == '\0') {
      local_1f8 = (undefined1  [8])((ulong)local_1f8 & 0xffffffff00000000);
      local_1f0._M_p = "Migrating a Device is only valid in CCM Mode";
      local_1e8 = 0x2c;
      local_1e0._M_allocated_capacity = 0;
      local_1d0[0] = (parse_func)0x0;
      pcVar5 = "Migrating a Device is only valid in CCM Mode";
      local_1e0._8_8_ = local_1f8;
      write.handler_ = (format_string_checker<char> *)local_1f8;
      while (pcVar5 != "") {
        cVar1 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar1 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar5,"");
            goto LAB_001546ad;
          }
          cVar1 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
        operator()(&write,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1f8);
      }
LAB_001546ad:
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_1f8;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_198,(v10 *)"Migrating a Device is only valid in CCM Mode",
                 (string_view)ZEXT816(0x2c),args_00);
      local_1c0._0_4_ = kInvalidState;
      std::__cxx11::string::string((string *)&local_1b8,(string *)&local_198);
      goto LAB_001546e0;
    }
    Address::Set((Error *)local_1f8,&dstAddr,aDstAddr);
    pEVar4 = Error::operator=(&error,(Error *)local_1f8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1f0);
    if (EVar2 != kNone) goto LAB_00154704;
    if (0x10 < aDstNetworkName->_M_string_length) {
      local_1f8._0_4_ = ulong_long_type;
      local_1f8._4_4_ = ulong_long_type;
      local_1f0._M_p = "Network Name length={} > {}";
      local_1e8 = 0x1b;
      local_1e0._M_allocated_capacity = 0x200000000;
      local_1d0[0] = ::fmt::v10::detail::
                     parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_1c8 = ::fmt::v10::detail::
                  parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
      pcVar5 = "Network Name length={} > {}";
      local_1e0._8_8_ = local_1f8;
      while (pcVar6 = pcVar5, pcVar6 != "") {
        pcVar5 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar5 == "") || (*pcVar5 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar5 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long,unsigned_long>&>
                             (pcVar6,"",
                              (format_string_checker<char,_void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_1f8);
        }
      }
      local_1f8 = (undefined1  [8])aDstNetworkName->_M_string_length;
      local_1e8 = 0x10;
      fmt.size_ = 0x44;
      fmt.data_ = (char *)0x1b;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_1f8;
      ::fmt::v10::vformat_abi_cxx11_(&local_198,(v10 *)"Network Name length={} > {}",fmt,args_01);
      local_1c0._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)&local_1b8,(string *)&local_198);
      goto LAB_001546e0;
    }
    std::__cxx11::string::string((string *)local_1c0,"/c/nm",(allocator *)&local_198);
    coap::Message::SetUriPath((Error *)local_1f8,&request,(string *)local_1c0);
    pEVar4 = Error::operator=(&error,(Error *)local_1f8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)local_1c0);
    if (EVar2 != kNone) goto LAB_00154704;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])(this);
    tlv::Tlv::Tlv((Tlv *)local_1c0,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
    AppendTlv((Error *)local_1f8,&request,(Tlv *)local_1c0);
    pEVar4 = Error::operator=(&error,(Error *)local_1f8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1f0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1b8);
    if (EVar2 != kNone) goto LAB_00154704;
    tlv::Tlv::Tlv((Tlv *)local_1c0,kNetworkDiagTimeout,aDstNetworkName,kMeshCoP);
    AppendTlv((Error *)local_1f8,&request,(Tlv *)local_1c0);
    pEVar4 = Error::operator=(&error,(Error *)local_1f8);
    EVar2 = pEVar4->mCode;
    std::__cxx11::string::~string((string *)&local_1f0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_1b8);
    if (EVar2 != kNone) goto LAB_00154704;
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      SignRequest((Error *)local_1f8,this,&request,kMeshCoP,true);
      pEVar4 = Error::operator=(&error,(Error *)local_1f8);
      EVar2 = pEVar4->mCode;
      std::__cxx11::string::~string((string *)&local_1f0);
      if (EVar2 != kNone) goto LAB_00154704;
    }
    local_118 = (code *)0x0;
    pcStack_110 = (code *)0x0;
    local_128._M_unused._M_object = (void *)0x0;
    local_128._8_8_ = 0;
    this_00 = (function<void_(ot::commissioner::Error)> *)operator_new(0x20);
    std::function<void_(ot::commissioner::Error)>::function(this_00,&onResponse.aHandler);
    pcStack_110 = std::
                  _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:969:23)>
                  ::_M_invoke;
    local_118 = std::
                _Function_handler<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/commissioner_impl.cpp:969:23)>
                ::_M_manager;
    local_128._M_unused._M_object = this_00;
    ProxyClient::SendRequest
              (&this->mProxyClient,&request,(ResponseHandler *)&local_128,&dstAddr,0xf0bf);
    std::_Function_base::~_Function_base((_Function_base *)&local_128);
    std::__cxx11::string::string((string *)local_1c0,"mgmt",(allocator *)&write);
    local_1f8 = (undefined1  [8])((ulong)(uint)local_1f8._4_4_ << 0x20);
    local_1f0._M_p = "sent MGMT_NET_MIGRATE.req";
    local_1e8 = 0x19;
    local_1e0._M_allocated_capacity = 0;
    local_1d0[0] = (parse_func)0x0;
    pcVar5 = "sent MGMT_NET_MIGRATE.req";
    local_1e0._8_8_ = local_1f8;
    while (pcVar6 = pcVar5, pcVar6 != "") {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_1f8);
      }
    }
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)local_1f8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_198,(v10 *)"sent MGMT_NET_MIGRATE.req",(string_view)ZEXT816(0x19),args_02);
    Log(kDebug,(string *)local_1c0,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    this_01 = (string *)local_1c0;
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_00154704:
  if (error.mCode != kNone) {
    Error::Error((Error *)local_e0,&error);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&onResponse);
  coap::Message::~Message(&request);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dstAddr);
  std::__cxx11::string::~string((string *)&error.mMessage);
  return;
}

Assistant:

void CommissionerImpl::CommandMigrate(ErrorHandler       aHandler,
                                      const std::string &aDstAddr,
                                      const std::string &aDstNetworkName)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError, /* aStateTlvIsMandatory */ false));
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("Migrating a Device is only valid in CCM Mode"));

    SuccessOrExit(error = dstAddr.Set(aDstAddr));
    VerifyOrExit(aDstNetworkName.size() <= kMaxNetworkNameLength,
                 error =
                     ERROR_INVALID_ARGS("Network Name length={} > {}", aDstNetworkName.size(), kMaxNetworkNameLength));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtNetMigrate));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kNetworkName, aDstNetworkName}));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_NET_MIGRATE.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}